

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr.cpp
# Opt level: O1

void embree::storeEXR(Ref<embree::Image> *img,FileName *fileName)

{
  size_t sVar1;
  pointer pcVar2;
  pointer data;
  int iVar3;
  long lVar4;
  Image *pIVar5;
  runtime_error *this;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  char *err;
  Color4 c;
  vector<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_> rgb;
  char *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  FileName *local_70;
  vector<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70 = fileName;
  std::vector<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>::vector
            (&local_68,img->ptr->height * img->ptr->width,(allocator_type *)&local_98);
  pIVar5 = img->ptr;
  uVar9 = pIVar5->height;
  if (uVar9 != 0) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      pIVar5 = img->ptr;
      if (pIVar5->width != 0) {
        lVar6 = 8;
        uVar9 = 0;
        do {
          (*(pIVar5->super_RefCount)._vptr_RefCount[4])(&local_98,pIVar5,uVar9,uVar8);
          lVar4 = img->ptr->width * lVar7;
          *(pointer *)
           ((long)local_68.
                  super__Vector_base<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar6 + -8 + lVar4) =
               local_98._M_dataplus._M_p;
          *(undefined4 *)
           ((long)&(local_68.
                    super__Vector_base<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start)->r + lVar6 + lVar4) =
               (undefined4)local_98._M_string_length;
          uVar9 = uVar9 + 1;
          pIVar5 = img->ptr;
          lVar6 = lVar6 + 0xc;
        } while (uVar9 < pIVar5->width);
      }
      uVar8 = uVar8 + 1;
      pIVar5 = img->ptr;
      uVar9 = pIVar5->height;
      lVar7 = lVar7 + 0xc;
    } while (uVar8 < uVar9);
  }
  data = local_68.super__Vector_base<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
  local_a0 = (char *)0x0;
  sVar1 = pIVar5->width;
  pcVar2 = (local_70->filename)._M_dataplus._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + (local_70->filename)._M_string_length);
  iVar3 = SaveEXR(&data->r,(int)sVar1,(int)uVar9,3,0,local_98._M_dataplus._M_p,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (iVar3 == 0) {
    if (local_68.super__Vector_base<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  if (local_a0 != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERR: ",5);
    std::operator<<((ostream *)&std::cerr,local_a0);
    if (local_a0 != (char *)0x0) {
      free(local_a0);
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar2 = (local_70->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (local_70->filename)._M_string_length);
  std::operator+(&local_98,"Could not save image ",&local_50);
  std::runtime_error::runtime_error(this,(string *)&local_98);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void storeEXR(const Ref<Image>& img, const FileName& fileName)
  {
    std::vector<Col3f> rgb(img->width * img->height);
    for (size_t y=0; y<img->height; ++y) {
        for (size_t x=0; x<img->width; ++x) {
            Color4 c = img->get(x, y);
            rgb[y * img->width + x] = Col3f(c.r, c.g, c.b);
        }
    }
    const char* err = NULL;
    int ret = SaveEXR((float*)rgb.data(), img->width, img->height, 3, 0, fileName.str().c_str(), &err);
    if (ret != TINYEXR_SUCCESS) {
      if (err) {
        std::cerr << "ERR: " << err;
        FreeEXRErrorMessage(err);
      }
      THROW_RUNTIME_ERROR("Could not save image " + fileName.str())
    }
  }